

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFExc.hh
# Opt level: O0

void __thiscall QPDFExc::~QPDFExc(QPDFExc *this)

{
  QPDFExc *this_local;
  
  ~QPDFExc(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

~QPDFExc() noexcept override = default;